

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void phmap::priv::(anonymous_namespace)::
     BtreeTest<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>
               (void)

{
  iterator iVar1;
  iterator iVar2;
  undefined1 local_98 [8];
  vector<long,_std::allocator<long>_> sorted_values;
  undefined1 local_70 [8];
  unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
  container;
  vector<long,_std::allocator<long>_> random_values;
  
  ConstTest<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>>();
  GenerateValuesWithSeed<long>
            ((vector<long,_std::allocator<long>_> *)
             &container.
              super_base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count,10000,40000,
             testing::FLAGS_gtest_random_seed);
  anon_unknown_0::
  unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
  ::unique_checker((unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
                    *)local_70);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_98,
             (vector<long,_std::allocator<long>_> *)
             &container.
              super_base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  iVar1 = std::vector<long,_std::allocator<long>_>::begin
                    ((vector<long,_std::allocator<long>_> *)local_98);
  iVar2 = std::vector<long,_std::allocator<long>_>::end
                    ((vector<long,_std::allocator<long>_> *)local_98);
  std::sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)iVar1._M_current,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)iVar2._M_current)
  ;
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ("sorted:    ",
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_70,(vector<long,_std::allocator<long>_> *)local_98);
  iVar1 = std::vector<long,_std::allocator<long>_>::begin
                    ((vector<long,_std::allocator<long>_> *)local_98);
  iVar2 = std::vector<long,_std::allocator<long>_>::end
                    ((vector<long,_std::allocator<long>_> *)local_98);
  std::reverse<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)iVar1._M_current,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)iVar2._M_current)
  ;
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ("rsorted:   ",
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_70,(vector<long,_std::allocator<long>_> *)local_98);
  DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_set<long,phmap::Less<long>,std::allocator<long>>,std::set<long,std::less<long>,std::allocator<long>>>,long>
            ("random:    ",
             (unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              *)local_70,
             (vector<long,_std::allocator<long>_> *)
             &container.
              super_base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<long,_std::allocator<long>_>::~vector((vector<long,_std::allocator<long>_> *)local_98)
  ;
  anon_unknown_0::
  unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
  ::~unique_checker((unique_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
                     *)local_70);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &container.
              super_base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
              .checker_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void BtreeTest() {
        ConstTest<T>();

        using V = typename remove_pair_const<typename T::value_type>::type;
        const std::vector<V> random_values = GenerateValuesWithSeed<V>(
            test_values, 4 * test_values,
            GTEST_FLAG_GET(random_seed));

        unique_checker<T, C> container;

        // Test key insertion/deletion in sorted order.
        std::vector<V> sorted_values(random_values);
        std::sort(sorted_values.begin(), sorted_values.end());
        DoTest("sorted:    ", &container, sorted_values);

        // Test key insertion/deletion in reverse sorted order.
        std::reverse(sorted_values.begin(), sorted_values.end());
        DoTest("rsorted:   ", &container, sorted_values);

        // Test key insertion/deletion in random order.
        DoTest("random:    ", &container, random_values);
    }